

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  char *__ptr;
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  z->zout = zout;
  if (z->z_expandable == 0) {
    *(char **)(in_FS_OFFSET + -0x20) = "output buffer limit";
    return 0;
  }
  __ptr = z->zout_start;
  uVar3 = (uint)((long)zout - (long)__ptr);
  if (!CARRY4(n,uVar3)) {
    for (uVar1 = *(int *)&z->zout_end - (int)__ptr; uVar1 < n + uVar3; uVar1 = uVar1 * 2) {
      if ((int)uVar1 < 0) goto LAB_00121438;
    }
    pcVar2 = (char *)realloc(__ptr,(ulong)uVar1);
    if (pcVar2 != (char *)0x0) {
      z->zout_start = pcVar2;
      z->zout = pcVar2 + ((long)zout - (long)__ptr & 0xffffffff);
      z->zout_end = pcVar2 + uVar1;
      return 1;
    }
  }
LAB_00121438:
  *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
  return 0;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   unsigned int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (unsigned int) (z->zout - z->zout_start);
   limit = old_limit = (unsigned) (z->zout_end - z->zout_start);
   if (UINT_MAX - cur < (unsigned) n) return stbi__err("outofmem", "Out of memory");
   while (cur + n > limit) {
      if(limit > UINT_MAX / 2) return stbi__err("outofmem", "Out of memory");
      limit *= 2;
   }
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}